

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::shaderexecutor::anon_unknown_0::BlockArrayIndexingCase::createInstance
          (BlockArrayIndexingCase *this,Context *ctx)

{
  ShaderType SVar1;
  BlockType BVar2;
  IndexExprType IVar3;
  Context *pCVar4;
  TestInstance *pTVar5;
  
  pTVar5 = (TestInstance *)operator_new(0x48);
  SVar1 = (this->super_OpaqueTypeIndexingCase).m_shaderType;
  pCVar4 = (Context *)(this->super_OpaqueTypeIndexingCase).m_name;
  BVar2 = this->m_blockType;
  IVar3 = (this->super_OpaqueTypeIndexingCase).m_indexExprType;
  pTVar5->m_context = ctx;
  pTVar5[1]._vptr_TestInstance = (_func_int **)ctx->m_testCtx;
  *(ShaderType *)&pTVar5[1].m_context = SVar1;
  pTVar5[2]._vptr_TestInstance = (_func_int **)&(this->super_OpaqueTypeIndexingCase).m_shaderSpec;
  pTVar5[2].m_context = pCVar4;
  *(IndexExprType *)&pTVar5[3]._vptr_TestInstance = IVar3;
  pTVar5->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00d4f128;
  *(BlockType *)((long)&pTVar5[3]._vptr_TestInstance + 4) = BVar2;
  pTVar5[3].m_context = (Context *)&this->m_readIndices;
  pTVar5[4]._vptr_TestInstance = (_func_int **)&this->m_inValues;
  return pTVar5;
}

Assistant:

TestInstance* BlockArrayIndexingCase::createInstance (Context& ctx) const
{
	return new BlockArrayIndexingCaseInstance(ctx,
											  m_shaderType,
											  m_shaderSpec,
											  m_name,
											  m_blockType,
											  m_indexExprType,
											  m_readIndices,
											  m_inValues);
}